

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O0

uint64_t conBytesLL(char *inArry,int start,int cnt)

{
  int local_24;
  ulong uStack_20;
  int i;
  unsigned_long_long outVal;
  int cnt_local;
  int start_local;
  char *inArry_local;
  
  uStack_20 = 0;
  for (local_24 = 0; local_24 < cnt; local_24 = local_24 + 1) {
    uStack_20 = (ulong)(byte)inArry[start + local_24] <<
                ((((char)cnt - (char)local_24) + -1) * '\b' & 0x3fU) | uStack_20;
  }
  return uStack_20;
}

Assistant:

uint64_t conBytesLL(char inArry[], int start, int cnt)
{
  unsigned long long outVal = 0;

  for (int i = 0; i < cnt; i++) {
    outVal = ((unsigned long long)(unsigned char)inArry[start + i]
              << ((cnt - i - 1) * 8)) |
             outVal;
  }

  return outVal;
}